

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.cc
# Opt level: O2

void __thiscall trng::yarn2::seed(yarn2 *this,result_type s1,result_type s2)

{
  int iVar1;
  int iVar2;
  
  iVar2 = s1 % 0x7fffffff;
  iVar1 = iVar2 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  (this->S).r[0] = iVar1;
  iVar1 = s2 % 0x7fffffff;
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  (this->S).r[1] = iVar2;
  return;
}

Assistant:

void yarn2::seed(yarn2::result_type s1, yarn2::result_type s2) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
  }